

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_buffer(Curl_send_buffer *in,void *inptr,size_t size)

{
  CURLcode CVar1;
  char *ptr;
  ulong uVar2;
  size_t size_00;
  
  uVar2 = in->size_used;
  if (CARRY8(size,uVar2)) {
    (*Curl_cfree)(in->buffer);
    in->buffer = (char *)0x0;
    (*Curl_cfree)(in);
LAB_0058931a:
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    ptr = in->buffer;
    if ((ptr == (char *)0x0) || (in->size_max - 1 < size + uVar2)) {
      size_00 = 0xffffffffffffffff;
      if ((-1 < (long)(uVar2 | size)) && (!CARRY8(uVar2 * 2,size * 2))) {
        size_00 = (size + uVar2) * 2;
      }
      if (ptr == (char *)0x0) {
        ptr = (char *)(*Curl_cmalloc)(size_00);
      }
      else {
        ptr = (char *)Curl_saferealloc(ptr,size_00);
      }
      if (ptr == (char *)0x0) {
        (*Curl_cfree)(in);
        goto LAB_0058931a;
      }
      in->buffer = ptr;
      in->size_max = size_00;
      uVar2 = in->size_used;
    }
    memcpy(ptr + uVar2,inptr,size);
    in->size_used = in->size_used + size;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_add_buffer(Curl_send_buffer *in, const void *inptr, size_t size)
{
  char *new_rb;
  size_t new_size;

  if(~size < in->size_used) {
    /* If resulting used size of send buffer would wrap size_t, cleanup
       the whole buffer and return error. Otherwise the required buffer
       size will fit into a single allocatable memory chunk */
    Curl_safefree(in->buffer);
    free(in);
    return CURLE_OUT_OF_MEMORY;
  }

  if(!in->buffer ||
     ((in->size_used + size) > (in->size_max - 1))) {

    /* If current buffer size isn't enough to hold the result, use a
       buffer size that doubles the required size. If this new size
       would wrap size_t, then just use the largest possible one */

    if((size > (size_t)-1 / 2) || (in->size_used > (size_t)-1 / 2) ||
       (~(size * 2) < (in->size_used * 2)))
      new_size = (size_t)-1;
    else
      new_size = (in->size_used+size) * 2;

    if(in->buffer)
      /* we have a buffer, enlarge the existing one */
      new_rb = Curl_saferealloc(in->buffer, new_size);
    else
      /* create a new buffer */
      new_rb = malloc(new_size);

    if(!new_rb) {
      /* If we failed, we cleanup the whole buffer and return error */
      free(in);
      return CURLE_OUT_OF_MEMORY;
    }

    in->buffer = new_rb;
    in->size_max = new_size;
  }
  memcpy(&in->buffer[in->size_used], inptr, size);

  in->size_used += size;

  return CURLE_OK;
}